

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall
ON_V5_MeshDoubleVertices::DeleteAfterRead
          (ON_V5_MeshDoubleVertices *this,ON_BinaryArchive *archive,ON_Object *parent_object)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ON_BoundingBox local_60;
  uint local_2c;
  ON_Mesh *pOStack_28;
  uint vertex_count;
  ON_Mesh *mesh;
  ON_Object *parent_object_local;
  ON_BinaryArchive *archive_local;
  ON_V5_MeshDoubleVertices *this_local;
  
  mesh = (ON_Mesh *)parent_object;
  parent_object_local = (ON_Object *)archive;
  archive_local = (ON_BinaryArchive *)this;
  pOStack_28 = ON_Mesh::Cast(parent_object);
  if ((pOStack_28 != (ON_Mesh *)0x0) &&
     (uVar2 = ON_SimpleArray<ON_3dPoint>::UnsignedCount
                        (&(pOStack_28->m_dV).super_ON_SimpleArray<ON_3dPoint>), uVar2 == 0)) {
    uVar2 = ON_Mesh::VertexUnsignedCount(pOStack_28);
    local_2c = uVar2;
    uVar3 = ON_SimpleArray<ON_3dPoint>::UnsignedCount
                      (&(this->m_V5_dV).super_ON_SimpleArray<ON_3dPoint>);
    if (uVar2 == uVar3) {
      ON_3dPointArray::operator=(&pOStack_28->m_dV,&this->m_V5_dV);
      bVar1 = ON_Mesh::HasSynchronizedDoubleAndSinglePrecisionVertices(pOStack_28);
      if (bVar1) {
        ON_Mesh::InvalidateVertexBoundingBox(pOStack_28);
        ON_Geometry::BoundingBox(&local_60,&pOStack_28->super_ON_Geometry);
      }
      else {
        ON_Mesh::DestroyDoublePrecisionVertices(pOStack_28);
      }
    }
  }
  return true;
}

Assistant:

bool ON_V5_MeshDoubleVertices::DeleteAfterRead(
  const class ON_BinaryArchive& archive,
  class ON_Object* parent_object
  ) const
{
  ON_Mesh* mesh = ON_Mesh::Cast(parent_object);
  if (nullptr != mesh && 0 == mesh->m_dV.UnsignedCount() )
  {
    const unsigned int vertex_count = mesh->VertexUnsignedCount();
    if (vertex_count == m_V5_dV.UnsignedCount())
    {
      mesh->m_dV = m_V5_dV;
      if (false == mesh->HasSynchronizedDoubleAndSinglePrecisionVertices())
        mesh->DestroyDoublePrecisionVertices();
      else
      {
        // update vertex bounding boxes
        mesh->InvalidateVertexBoundingBox();
        mesh->BoundingBox();
      }
    }
  }
  return true;
}